

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _dequeIterator.hpp
# Opt level: O0

dequeIterator<int,_64UL> * __thiscall
ft::dequeIterator<int,_64UL>::operator=
          (dequeIterator<int,_64UL> *this,dequeIterator<int,_64UL> *rhs)

{
  dequeIterator<int,_64UL> *rhs_local;
  dequeIterator<int,_64UL> *this_local;
  
  if (rhs != this) {
    this->m_cur = rhs->m_cur;
    this->m_first = rhs->m_first;
    this->m_last = rhs->m_last;
    this->m_node = rhs->m_node;
  }
  return this;
}

Assistant:

dequeIterator&	operator=(dequeIterator const & rhs) {
		if (&rhs != this) {
			this->m_cur = rhs.m_cur;
			this->m_first = rhs.m_first;
			this->m_last = rhs.m_last;
			this->m_node = rhs.m_node;
		}
		return *this;
	}